

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O3

string * __thiscall
duckdb::ConstantFilter::ToString
          (string *__return_storage_ptr__,ConstantFilter *this,string *column_name)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  ulong *local_80;
  long local_78;
  ulong local_70;
  long lStack_68;
  string local_60;
  string local_40;
  
  ExpressionTypeToOperator_abi_cxx11_
            (&local_40,(duckdb *)(ulong)(byte)(this->super_TableFilter).field_0x9,
             (ExpressionType)column_name);
  plVar2 = (long *)::std::__cxx11::string::replace
                             ((ulong)&local_40,0,(char *)0x0,(ulong)(column_name->_M_dataplus)._M_p)
  ;
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_70 = *puVar4;
    lStack_68 = plVar2[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *puVar4;
    local_80 = (ulong *)*plVar2;
  }
  local_78 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  Value::ToSQLString_abi_cxx11_(&local_60,&this->constant);
  uVar5 = 0xf;
  if (local_80 != &local_70) {
    uVar5 = local_70;
  }
  if (uVar5 < local_60._M_string_length + local_78) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      uVar6 = local_60.field_2._M_allocated_capacity;
    }
    if (local_60._M_string_length + local_78 <= (ulong)uVar6) {
      puVar3 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
      goto LAB_00722d86;
    }
  }
  puVar3 = (undefined8 *)
           ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60._M_dataplus._M_p);
LAB_00722d86:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar6 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string ConstantFilter::ToString(const string &column_name) const {
	return column_name + ExpressionTypeToOperator(comparison_type) + constant.ToSQLString();
}